

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-time.c
# Opt level: O1

int register_leap_second(double leap_second)

{
  size_t __size;
  double dVar1;
  uint uVar2;
  long lVar3;
  int iVar4;
  void *pvVar5;
  long lVar6;
  ulong uVar7;
  long in_FS_OFFSET;
  double dVar8;
  
  if (((long)*(int *)(in_FS_OFFSET + -0x100) & 0xfU) == 0) {
    __size = (long)*(int *)(in_FS_OFFSET + -0x100) * 8 + 0x80;
    pvVar5 = realloc(*(void **)(in_FS_OFFSET + -0x108),__size);
    if (pvVar5 == (void *)0x0) {
      coda_set_error(-1,"out of memory (could not allocate %lu bytes) (%s:%u)",__size,
                     "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-time.c"
                     ,0x261);
      return -1;
    }
    *(void **)(in_FS_OFFSET + -0x108) = pvVar5;
  }
  uVar2 = *(uint *)(in_FS_OFFSET + -0x100);
  lVar6 = (long)(int)uVar2;
  if ((0 < lVar6) &&
     (lVar3 = *(long *)(in_FS_OFFSET + -0x108), leap_second <= *(double *)(lVar3 + -8 + lVar6 * 8)))
  {
    iVar4 = -1;
    uVar7 = 0;
    dVar8 = leap_second;
    do {
      dVar1 = *(double *)(lVar3 + uVar7 * 8);
      leap_second = dVar8;
      if (dVar8 <= dVar1) {
        if ((dVar8 != dVar1) || (NAN(dVar8) || NAN(dVar1))) {
          *(double *)(lVar3 + uVar7 * 8) = dVar8;
          leap_second = dVar1;
        }
        else {
          iVar4 = 0;
        }
        if ((dVar8 == dVar1) && (!NAN(dVar8) && !NAN(dVar1))) {
          return iVar4;
        }
      }
      uVar7 = uVar7 + 1;
      dVar8 = leap_second;
    } while (uVar2 != uVar7);
  }
  *(double *)(*(long *)(in_FS_OFFSET + -0x108) + lVar6 * 8) = leap_second;
  *(uint *)(in_FS_OFFSET + -0x100) = uVar2 + 1;
  return 0;
}

Assistant:

static int register_leap_second(double leap_second)
{
    int i;

    if (num_leap_seconds % BLOCK_SIZE == 0)
    {
        double *new_leap_second_table;

        new_leap_second_table = realloc(leap_second_table, (num_leap_seconds + BLOCK_SIZE) * sizeof(double));
        if (new_leap_second_table == NULL)
        {
            coda_set_error(CODA_ERROR_OUT_OF_MEMORY, "out of memory (could not allocate %lu bytes) (%s:%u)",
                           (num_leap_seconds + BLOCK_SIZE) * sizeof(double), __FILE__, __LINE__);
            return -1;
        }
        leap_second_table = new_leap_second_table;
    }
    if (num_leap_seconds > 0 && leap_second <= leap_second_table[num_leap_seconds - 1])
    {
        /* do sorted insert */
        for (i = 0; i < num_leap_seconds; i++)
        {
            if (leap_second <= leap_second_table[i])
            {
                double tmp;

                if (leap_second == leap_second_table[i])
                {
                    /* ignore double leap_second entries */
                    return 0;
                }
                tmp = leap_second_table[i];
                leap_second_table[i] = leap_second;
                leap_second = tmp;
            }
        }
    }
    leap_second_table[num_leap_seconds] = leap_second;
    num_leap_seconds++;

    return 0;
}